

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O2

void Col_SortWords(Col_Word *first,Col_Word *last,Col_WordCompareProc *proc,
                  Col_ClientData clientData)

{
  Col_Word CVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  Col_Word *pCVar5;
  Col_Word CVar6;
  Col_Word CVar7;
  Col_Word *pCVar8;
  long lVar9;
  long lVar10;
  Col_Word *first_00;
  Col_Word *pCVar11;
  Col_Word *local_68;
  Col_Word *local_60;
  
  do {
    if (last <= first) {
      return;
    }
    first_00 = first + -1;
    CVar1 = *last;
    pCVar11 = last;
    local_68 = last;
    local_60 = first_00;
LAB_0010cc89:
    lVar2 = (long)first_00 - (long)first;
    lVar3 = (long)last + (-0x10 - (long)first_00);
    do {
      lVar9 = lVar3;
      lVar10 = lVar2;
      first_00 = first_00 + 1;
      if (*first_00 == CVar1) break;
      iVar4 = (*proc)(*first_00,CVar1,clientData);
      lVar2 = lVar10 + 8;
      lVar3 = lVar9 + -8;
    } while (iVar4 < 0);
    do {
      pCVar11 = pCVar11 + -1;
      if ((CVar1 == *pCVar11) || (iVar4 = (*proc)(CVar1,*pCVar11,clientData), pCVar11 == first))
      break;
    } while (iVar4 < 0);
    if (first_00 < pCVar11) {
      CVar7 = *pCVar11;
      *pCVar11 = *first_00;
      *first_00 = CVar7;
      CVar6 = CVar1;
      if (CVar7 == CVar1) {
LAB_0010cd29:
        *first_00 = local_60[1];
        local_60[1] = CVar6;
        local_60 = local_60 + 1;
      }
      else {
        iVar4 = (*proc)(CVar7,CVar1,clientData);
        if (iVar4 == 0) {
          CVar6 = *first_00;
          goto LAB_0010cd29;
        }
      }
      CVar7 = CVar1;
      if (CVar1 != *pCVar11) break;
      goto LAB_0010cd66;
    }
    CVar1 = *last;
    *last = *first_00;
    *first_00 = CVar1;
    pCVar11 = first_00;
    for (pCVar8 = first; pCVar11 = pCVar11 + -1, pCVar5 = last, pCVar8 < local_60;
        pCVar8 = pCVar8 + 1) {
      CVar1 = *pCVar11;
      *pCVar11 = *pCVar8;
      *pCVar8 = CVar1;
      lVar10 = lVar10 + -8;
    }
    while( true ) {
      pCVar5 = pCVar5 + -1;
      first_00 = first_00 + 1;
      if (pCVar5 <= local_68) break;
      CVar1 = *pCVar5;
      *pCVar5 = *first_00;
      *first_00 = CVar1;
      lVar9 = lVar9 + -8;
    }
    if (lVar10 < lVar9) {
      Col_SortWords(first,pCVar11,proc,clientData);
      first = first_00;
    }
    else {
      Col_SortWords(first_00,last,proc,clientData);
      last = pCVar11;
    }
  } while( true );
  iVar4 = (*proc)(CVar1,*pCVar11,clientData);
  if (iVar4 == 0) {
    CVar7 = *pCVar11;
LAB_0010cd66:
    CVar6 = local_68[-1];
    local_68[-1] = CVar7;
    local_68 = local_68 + -1;
    *pCVar11 = CVar6;
  }
  goto LAB_0010cc89;
}

Assistant:

void
Col_SortWords(
    Col_Word *first,            /*!< First word of array to sort. */
    Col_Word *last,             /*!< Last word of array to sort. */
    Col_WordCompareProc *proc,  /*!< Comparison proc for sorting. */
    Col_ClientData clientData)  /*!< Opaque data passed as is to **proc**. */
{
/*! \cond IGNORE */
    Col_Word *i, *j, *k, *p, *q;
    Col_Word v;

#define SWAP(a, b) {Col_Word tmp=b; b=a; a=tmp;}

    /*
     * Entry point for tail recursive calls.
     */

#define TAIL_RECURSE(_first, _last) \
    first = (_first); last = (_last); goto start;

start:

    if (last <= first) return;
    i = p = first-1; j = q = last;
    v = *last;
    for (;;) {
        /*
         * Move from left to find an element that is not less.
         */

        while (*++i != v && proc(*i, v, clientData) < 0);

        /*
         * Move from right to find an element that is not greater.
         */

        while (v != *--j && proc(v, *j, clientData) < 0) if (j == first) break;

        /*
         * Stop if pointers have crossed.
         */

        if (i >= j) break;

        /*
         * Exchange.
         */

        SWAP(*i, *j);

        /*
         * If left element equal, exchange to left end.
         */

        if (*i == v || proc(*i, v, clientData) == 0) { p++; SWAP(*p, *i); }

        /*
         * If right element equal, exchange to right end.
         */

        if (v == *j || proc(v, *j, clientData) == 0) { q--; SWAP(*j, *q); }
    }
    SWAP(*i, *last); j = i-1; i = i+1;

    /*
     * Swap left equals to center.
     */

    for (k = first; k < p; k++, j--) SWAP(*k, *j);

    /*
     * Swap right equals to center.
     */

    for (k = last-1; k > q; k--, i++) SWAP(*i, *k);

    /*
     * Recurse on smallest subrange and tail call on largest to minimize
     * recursion depth and ensure O(logn) space.
     */

    if (j-first < last-i) {
        /*
         * Left subrange is shorter.
         */

        Col_SortWords(first, j, proc, clientData);
        TAIL_RECURSE(i, last);
    } else {
        /*
         * Right subrange is shorter.
         */

        Col_SortWords(i, last, proc, clientData);
        TAIL_RECURSE(first, j);
    }

#undef TAIL_RECURSE
#undef SWAP
/*! \endcond *//* IGNORE */
}